

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
::rehash_and_grow_if_necessary
          (raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
           *this)

{
  char *pcVar1;
  byte *pbVar2;
  char cVar3;
  ulong uVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  size_type sVar19;
  ctrl_t *pcVar20;
  size_t sVar21;
  size_t i;
  _Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
  extraout_RDX;
  _Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
  _Var22;
  slot_type *old_slot;
  slot_type *old_slot_00;
  slot_type *old_slot_01;
  slot_type *old_slot_02;
  _Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
  extraout_RDX_00;
  byte bVar23;
  ulong uVar24;
  size_t i_00;
  pair<std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
  p;
  FindInfo FVar25;
  allocator<int> aaStack_70 [64];
  
  uVar4 = this->capacity_;
  if (uVar4 == 0) {
    resize(this,1);
    return;
  }
  if ((uVar4 + 1 & uVar4) != 0) {
    __assert_fail("IsValidCapacity(capacity)",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x248,"size_t phmap::priv::CapacityToGrowth(size_t)");
  }
  if (uVar4 - (uVar4 >> 3) >> 1 < this->size_) {
    resize(this,uVar4 * 2 + 1);
    return;
  }
  uVar4 = this->capacity_;
  if ((uVar4 == 0) || ((uVar4 + 1 & uVar4) != 0)) {
    __assert_fail("IsValidCapacity(capacity_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x822,
                  "void phmap::priv::raw_hash_set<phmap::priv::(anonymous namespace)::StringPolicy, phmap::priv::(anonymous namespace)::StringHash, phmap::priv::(anonymous namespace)::StringEq, std::allocator<int>>::drop_deletes_without_resize() [Policy = phmap::priv::(anonymous namespace)::StringPolicy, Hash = phmap::priv::(anonymous namespace)::StringHash, Eq = phmap::priv::(anonymous namespace)::StringEq, Alloc = std::allocator<int>]"
                 );
  }
  if (uVar4 < 0xf) {
    __assert_fail("!is_small()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x823,
                  "void phmap::priv::raw_hash_set<phmap::priv::(anonymous namespace)::StringPolicy, phmap::priv::(anonymous namespace)::StringHash, phmap::priv::(anonymous namespace)::StringEq, std::allocator<int>>::drop_deletes_without_resize() [Policy = phmap::priv::(anonymous namespace)::StringPolicy, Hash = phmap::priv::(anonymous namespace)::StringHash, Eq = phmap::priv::(anonymous namespace)::StringEq, Alloc = std::allocator<int>]"
                 );
  }
  _Var22._M_head_impl =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this->ctrl_;
  if (*(char *)((long)&((_Var22._M_head_impl)->_M_dataplus)._M_p + uVar4) != -1) {
    __assert_fail("ctrl[capacity] == kSentinel",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x230,
                  "void phmap::priv::ConvertDeletedToEmptyAndFullToDeleted(ctrl_t *__restrict, size_t)"
                 );
  }
  pcVar20 = (ctrl_t *)((long)&((_Var22._M_head_impl)->_M_dataplus)._M_p + uVar4);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(pcVar20 + 1) !=
      _Var22._M_head_impl) {
    uVar24 = 0;
    do {
      pcVar1 = (char *)((long)&((_Var22._M_head_impl)->_M_dataplus)._M_p + uVar24);
      cVar3 = pcVar1[1];
      cVar5 = pcVar1[2];
      cVar6 = pcVar1[3];
      cVar7 = pcVar1[4];
      cVar8 = pcVar1[5];
      cVar9 = pcVar1[6];
      cVar10 = pcVar1[7];
      cVar11 = pcVar1[8];
      cVar12 = pcVar1[9];
      cVar13 = pcVar1[10];
      cVar14 = pcVar1[0xb];
      cVar15 = pcVar1[0xc];
      cVar16 = pcVar1[0xd];
      cVar17 = pcVar1[0xe];
      cVar18 = pcVar1[0xf];
      pbVar2 = (byte *)((long)&((_Var22._M_head_impl)->_M_dataplus)._M_p + uVar24);
      *pbVar2 = -(*pcVar1 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[1] = -(cVar3 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[2] = -(cVar5 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[3] = -(cVar6 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[4] = -(cVar7 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[5] = -(cVar8 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[6] = -(cVar9 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[7] = -(cVar10 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[8] = -(cVar11 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[9] = -(cVar12 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[10] = -(cVar13 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xb] = -(cVar14 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xc] = -(cVar15 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xd] = -(cVar16 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xe] = -(cVar17 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xf] = -(cVar18 < '\0') & 0x7eU ^ 0xfe;
      uVar24 = uVar24 + 0x10;
    } while (uVar4 + 1 != uVar24);
  }
  sVar19 = (_Var22._M_head_impl)->_M_string_length;
  (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(pcVar20 + 1))->_M_dataplus
  )._M_p = ((_Var22._M_head_impl)->_M_dataplus)._M_p;
  *(size_type *)(pcVar20 + 9) = sVar19;
  *pcVar20 = -1;
  if (this->capacity_ == 0) {
    i_00 = 0;
  }
  else {
    i_00 = 0;
    do {
      if (this->ctrl_[i_00] == -2) {
        p.second.
        super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        .
        super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
        ._M_head_impl =
             (_Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              )(_Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                )_Var22._M_head_impl;
        p.first.
        super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        .
        super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
        ._M_head_impl =
             (_Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              )(_Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                )this->slots_[i_00].pair.first._M_string_length;
        sVar21 = (anonymous_namespace)::StringPolicy::
                 apply_impl<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,phmap::priv::(anonymous_namespace)::StringHash,phmap::priv::(anonymous_namespace)::StringEq,std::allocator<int>>::HashElement,std::__cxx11::string_const&,std::tuple<std::__cxx11::string_const&>,void>
                           ((HashElement *)this->slots_[i_00].pair.first._M_dataplus._M_p,p);
        FVar25 = find_first_non_full((raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
                                      *)this->ctrl_,this->capacity_);
        i = FVar25.offset;
        uVar4 = this->capacity_;
        if ((uVar4 + 1 & uVar4) != 0) {
          __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                        ,0x95,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
        }
        uVar24 = (sVar21 >> 7 ^ (ulong)this->ctrl_ >> 0xc) & uVar4;
        bVar23 = (byte)sVar21;
        if (((i_00 - uVar24 ^ i - uVar24) & uVar4) < 0x10) {
          bVar23 = bVar23 & 0x7f;
        }
        else {
          cVar3 = this->ctrl_[i];
          if (cVar3 == -2) {
            set_ctrl(this,i,bVar23 & 0x7f);
            hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,void>::
            transfer<std::allocator<int>>(aaStack_70,this->slots_ + i_00,old_slot_00);
            hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,void>::
            transfer<std::allocator<int>>
                      ((allocator<int> *)(this->slots_ + i_00),this->slots_ + i,old_slot_01);
            hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,void>::
            transfer<std::allocator<int>>
                      ((allocator<int> *)(this->slots_ + i),(slot_type *)aaStack_70,old_slot_02);
            i_00 = i_00 - 1;
            _Var22._M_head_impl = extraout_RDX_00._M_head_impl;
            goto LAB_00121c3c;
          }
          if (cVar3 != -0x80) {
            __assert_fail("IsDeleted(ctrl_[new_i])",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                          ,0x853,
                          "void phmap::priv::raw_hash_set<phmap::priv::(anonymous namespace)::StringPolicy, phmap::priv::(anonymous namespace)::StringHash, phmap::priv::(anonymous namespace)::StringEq, std::allocator<int>>::drop_deletes_without_resize() [Policy = phmap::priv::(anonymous namespace)::StringPolicy, Hash = phmap::priv::(anonymous namespace)::StringHash, Eq = phmap::priv::(anonymous namespace)::StringEq, Alloc = std::allocator<int>]"
                         );
          }
          set_ctrl(this,i,bVar23 & 0x7f);
          hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,void>::
          transfer<std::allocator<int>>
                    ((allocator<int> *)(this->slots_ + i),this->slots_ + i_00,old_slot);
          bVar23 = 0x80;
        }
        set_ctrl(this,i_00,bVar23);
        _Var22._M_head_impl = extraout_RDX._M_head_impl;
      }
LAB_00121c3c:
      i_00 = i_00 + 1;
    } while (i_00 != this->capacity_);
  }
  reset_growth_left(this,i_00);
  return;
}

Assistant:

void rehash_and_grow_if_necessary() {
        if (capacity_ == 0) {
            resize(1);
        } else if (size() <= CapacityToGrowth(capacity()) / 2) {
            // Squash DELETED without growing if there is enough capacity.
            drop_deletes_without_resize();
        } else {
            // Otherwise grow the container.
            resize(capacity_ * 2 + 1);
        }
    }